

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  char *pcVar1;
  byte Entry;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Str_t *p_00;
  Wlc_Obj_t *p_01;
  int *piVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  p_00 = Vec_StrAlloc(1000);
  lVar8 = 0;
  do {
    if (p->vInits->nSize <= lVar8) {
      Vec_StrPush(p_00,'\0');
      pcVar1 = p_00->pArray;
      free(p_00);
      return pcVar1;
    }
    iVar2 = Vec_IntEntry(p->vInits,(int)lVar8);
    if (iVar2 < 0) {
      for (; iVar2 != 0; iVar2 = iVar2 + 1) {
        Vec_StrPush(p_00,'0');
      }
    }
    else {
      p_01 = Wlc_NtkObj(p,iVar2);
      uVar3 = p_01->End - p_01->Beg;
      uVar9 = -uVar3;
      if (0 < (int)uVar3) {
        uVar9 = uVar3;
      }
      while( true ) {
        uVar6 = *(ushort *)p_01 & 0x3f;
        if (uVar6 != 7) break;
        iVar2 = Wlc_ObjFaninId0(p_01);
        p_01 = Wlc_NtkObj(p,iVar2);
      }
      if ((uVar6 == 6) && ((*(ushort *)p_01 >> 0xb & 1) == 0)) {
        piVar5 = Wlc_ObjConstValue(p_01);
      }
      else {
        piVar5 = (int *)0x0;
      }
      uVar3 = 0;
      while( true ) {
        iVar4 = p_01->End - p_01->Beg;
        iVar2 = -iVar4;
        if (0 < iVar4) {
          iVar2 = iVar4;
        }
        uVar7 = iVar2 + 1U;
        if ((int)(uVar9 + 1) < (int)(iVar2 + 1U)) {
          uVar7 = uVar9 + 1;
        }
        if (uVar7 <= uVar3) break;
        if (piVar5 == (int *)0x0) {
          Entry = 0x78;
        }
        else {
          Entry = ((uint)piVar5[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0 | 0x30;
        }
        Vec_StrPush(p_00,Entry);
        uVar3 = uVar3 + 1;
      }
      for (; uVar3 <= uVar9; uVar3 = uVar3 + 1) {
        Vec_StrPush(p_00,'0');
      }
      if ((piVar5 == (int *)0x0) && ((*(uint *)p_01 >> 0xb & 1) == 0)) {
        if (((ushort)*(uint *)p_01 & 0x3d) != 1) {
          __assert_fail("Wlc_ObjIsCi(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                        ,0x12d,"int Wlc_ObjCiId(Wlc_Obj_t *)");
        }
        uVar9 = (p_01->field_10).Fanins[1];
      }
      else {
        uVar9 = ~uVar9;
      }
      if (p->vInits->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vInits->pArray[lVar8] = uVar9;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = (pObj->Type == WLC_OBJ_CONST && !pObj->fXConst) ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'x') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, (pInits || pObj->fXConst) ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}